

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImU32 col;
  float fVar5;
  byte local_b9;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  byte local_51;
  float local_50;
  undefined1 auStack_4c [3];
  bool push_clip_rect;
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  char *type_local;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  register0x00000000 = &GImGui->DragDropPayload;
  if ((GImGui->DragDropActive & 1U) == 0) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x271d,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount != -1) {
    if ((type == (char *)0x0) || (bVar4 = ImGuiPayload::IsDataType(register0x00000000,type), bVar4))
    {
      r.Max.x._3_1_ = pIVar3->DragDropAcceptIdPrev == pIVar3->DragDropTargetId;
      _auStack_4c = (pIVar3->DragDropTargetRect).Min;
      r.Min = (pIVar3->DragDropTargetRect).Max;
      fVar5 = ImRect::GetWidth((ImRect *)auStack_4c);
      local_50 = ImRect::GetHeight((ImRect *)auStack_4c);
      local_50 = fVar5 * local_50;
      if (local_50 <= pIVar3->DragDropAcceptIdCurrRectSurface) {
        pIVar3->DragDropAcceptFlags = flags;
        pIVar3->DragDropAcceptIdCurr = pIVar3->DragDropTargetId;
        pIVar3->DragDropAcceptIdCurrRectSurface = local_50;
      }
      stack0xffffffffffffffc8->Preview = (bool)(r.Max.x._3_1_ & 1);
      if (((pIVar3->DragDropSourceFlags & 0x800U) == 0 && (flags & 0x800U) == 0) &&
         ((stack0xffffffffffffffc8->Preview & 1U) != 0)) {
        ImRect::Expand((ImRect *)auStack_4c,3.5);
        bVar4 = ImRect::Contains(&pIVar1->ClipRect,(ImRect *)auStack_4c);
        local_51 = (bVar4 ^ 0xffU) & 1;
        if (local_51 != 0) {
          pIVar2 = pIVar1->DrawList;
          ImVec2::ImVec2(&local_64,1.0,1.0);
          local_5c = ::operator-((ImVec2 *)auStack_4c,&local_64);
          ImVec2::ImVec2(&local_74,1.0,1.0);
          local_6c = ::operator+(&r.Min,&local_74);
          ImDrawList::PushClipRect(pIVar2,local_5c,local_6c,false);
        }
        pIVar2 = pIVar1->DrawList;
        col = GetColorU32(0x30,1.0);
        ImDrawList::AddRect(pIVar2,(ImVec2 *)auStack_4c,&r.Min,col,0.0,0,2.0);
        if ((local_51 & 1) != 0) {
          ImDrawList::PopClipRect(pIVar1->DrawList);
        }
      }
      pIVar3->DragDropAcceptFrameCount = pIVar3->FrameCount;
      local_b9 = 0;
      if ((r.Max.x._3_1_ & 1) != 0) {
        bVar4 = IsMouseDown(pIVar3->DragDropMouseButton);
        local_b9 = bVar4 ^ 0xff;
      }
      stack0xffffffffffffffc8->Delivery = (bool)(local_b9 & 1);
      if (((stack0xffffffffffffffc8->Delivery & 1U) == 0) && ((flags & 0x400U) == 0)) {
        type_local = (char *)0x0;
      }
      else {
        type_local = (char *)stack0xffffffffffffffc8;
      }
    }
    else {
      type_local = (char *)0x0;
    }
    return (ImGuiPayload *)type_local;
  }
  __assert_fail("payload.DataFrameCount != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                ,0x271e,
                "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
               );
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAGDROP: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}